

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

int cram_decode_TD(char *cp,cram_block_compression_hdr *h)

{
  size_t sVar1;
  int iVar2;
  cram_block *b_00;
  uchar *puVar3;
  uchar **ppuVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_44;
  int sz;
  int i;
  int nTL;
  int32_t blk_size;
  cram_block *b;
  uchar *dat;
  char *op;
  cram_block_compression_hdr *h_local;
  char *cp_local;
  
  b_00 = cram_new_block(FILE_HEADER,0);
  if (b_00 == (cram_block *)0x0) {
    cp_local._4_4_ = -1;
  }
  else {
    h->TD_blk = b_00;
    if ((byte)*cp < 0x80) {
      i = (int)(byte)*cp;
      local_4c = 1;
    }
    else {
      if ((byte)*cp < 0xc0) {
        i = CONCAT11(*cp,cp[1]) & 0x3fff;
        local_50 = 2;
      }
      else {
        if ((byte)*cp < 0xe0) {
          i = ((byte)*cp & 0x1f) << 0x10 | (uint)(byte)cp[1] << 8 | (uint)(byte)cp[2];
          local_54 = 3;
        }
        else {
          if ((byte)*cp < 0xf0) {
            i = ((byte)*cp & 0xf) << 0x18 | (uint)(byte)cp[1] << 0x10 | (uint)(byte)cp[2] << 8 |
                (uint)(byte)cp[3];
            local_58 = 4;
          }
          else {
            i = (uint)(byte)*cp << 0x1c | (uint)(byte)cp[1] << 0x14 | (uint)(byte)cp[2] << 0xc |
                (uint)(byte)cp[3] << 4 | (byte)cp[4] & 0xf;
            local_58 = 5;
          }
          local_54 = local_58;
        }
        local_50 = local_54;
      }
      local_4c = local_50;
    }
    iVar2 = (int)(cp + local_4c);
    if (i == 0) {
      h->nTL = 0;
      h->TL = (uchar **)0x0;
      cram_free_block(b_00);
      cp_local._4_4_ = iVar2 - (int)cp;
    }
    else {
      while (b_00->alloc <= b_00->byte + (long)i) {
        if (b_00->alloc == 0) {
          local_60 = 1024.0;
        }
        else {
          sVar1 = b_00->alloc;
          auVar5._8_4_ = (int)(sVar1 >> 0x20);
          auVar5._0_8_ = sVar1;
          auVar5._12_4_ = 0x45300000;
          local_60 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
        }
        b_00->alloc = (long)local_60 |
                      (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
        puVar3 = (uchar *)realloc(b_00->data,b_00->alloc);
        b_00->data = puVar3;
      }
      memcpy(b_00->data + b_00->byte,cp + local_4c,(long)i);
      b_00->byte = (long)i + b_00->byte;
      cp_local._4_4_ = (iVar2 + i) - (int)cp;
      if (b_00->data[b_00->byte - 1] != '\0') {
        while (b_00->alloc <= b_00->byte + 1) {
          if (b_00->alloc == 0) {
            local_68 = 1024.0;
          }
          else {
            sVar1 = b_00->alloc;
            auVar6._8_4_ = (int)(sVar1 >> 0x20);
            auVar6._0_8_ = sVar1;
            auVar6._12_4_ = 0x45300000;
            local_68 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
          }
          b_00->alloc = (long)local_68 |
                        (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
          puVar3 = (uchar *)realloc(b_00->data,b_00->alloc);
          b_00->data = puVar3;
        }
        sVar1 = b_00->byte;
        b_00->byte = sVar1 + 1;
        b_00->data[sVar1] = '\0';
      }
      puVar3 = b_00->data;
      sz = 0;
      for (local_44 = 0; (ulong)(long)local_44 < b_00->byte; local_44 = local_44 + 1) {
        sz = sz + 1;
        for (; puVar3[local_44] != '\0'; local_44 = local_44 + 1) {
        }
      }
      h->nTL = sz;
      ppuVar4 = (uchar **)calloc((long)h->nTL,8);
      h->TL = ppuVar4;
      if (ppuVar4 == (uchar **)0x0) {
        cp_local._4_4_ = -1;
      }
      else {
        sz = 0;
        for (local_44 = 0; (ulong)(long)local_44 < b_00->byte; local_44 = local_44 + 1) {
          h->TL[sz] = puVar3 + local_44;
          for (; puVar3[local_44] != '\0'; local_44 = local_44 + 1) {
          }
          sz = sz + 1;
        }
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

int cram_decode_TD(char *cp, cram_block_compression_hdr *h) {
    char *op = cp;
    unsigned char *dat;
    cram_block *b;
    int32_t blk_size;
    int nTL, i, sz;

    if (!(b = cram_new_block(0, 0)))
	return -1;
    h->TD_blk = b;

    /* Decode */
    cp += itf8_get(cp, &blk_size);
    if (!blk_size) {
	h->nTL = 0;
	h->TL = NULL;
	cram_free_block(b);
        return cp - op;
    }

    BLOCK_APPEND(b, cp, blk_size);
    cp += blk_size;
    sz = cp - op;

    // Force nul termination if missing
    if (BLOCK_DATA(b)[BLOCK_SIZE(b)-1])
	BLOCK_APPEND_CHAR(b, '\0');

    /* Set up TL lookup table */
    dat = BLOCK_DATA(b);

    // Count
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	nTL++;
	while (dat[i])
	    i++;
    }

    // Copy
    h->nTL = nTL;
    if (!(h->TL = calloc(h->nTL, sizeof(unsigned char *))))
	return -1;
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	h->TL[nTL++] = &dat[i];
	while (dat[i])
	    i++;
    }
    
    return sz;
}